

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_sfp.c
# Opt level: O2

int csp_sfp_send_own_memcpy
              (csp_conn_t *conn,void *data,uint totalsize,uint mtu,uint32_t timeout,
              csp_memcpy_fnc_t memcpyfcn)

{
  uint8_t *puVar1;
  _Bool _Var2;
  int iVar3;
  csp_packet_t *packet;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (mtu - 0xf9 < 0xffffff08) {
    iVar3 = -2;
  }
  else {
    uVar5 = 0;
    while ((uVar4 = totalsize - uVar5, uVar5 <= totalsize && uVar4 != 0 &&
           (_Var2 = csp_conn_is_active(conn), _Var2))) {
      packet = csp_buffer_get(0);
      if (packet == (csp_packet_t *)0x0) {
        return -1;
      }
      if (mtu <= uVar4) {
        uVar4 = mtu;
      }
      uVar6 = (ulong)uVar4;
      (*memcpyfcn)(&packet->field_5,(csp_const_memptr_t)((ulong)uVar5 + (long)data),uVar6);
      puVar1 = &(conn->idout).flags;
      *puVar1 = *puVar1 | 0x10;
      packet->length = (short)uVar4 + 8;
      *(uint *)(packet->header + uVar6 + 0xc) =
           totalsize >> 0x18 | (totalsize & 0xff0000) >> 8 | (totalsize & 0xff00) << 8 |
           totalsize << 0x18;
      *(uint *)(packet->header + uVar6 + 8) =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      csp_send(conn,packet);
      uVar5 = uVar4 + uVar5;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int csp_sfp_send_own_memcpy(csp_conn_t * conn, const void * data, unsigned int totalsize, unsigned int mtu, uint32_t timeout, csp_memcpy_fnc_t memcpyfcn) {
	if (mtu == 0 || mtu + sizeof(sfp_header_t) > CSP_BUFFER_SIZE) {
		return CSP_ERR_INVAL;
	}

	unsigned int count = 0;
	while ((count < totalsize) && csp_conn_is_active(conn)) {

		sfp_header_t * sfp_header;

		/* Allocate packet */
		csp_packet_t * packet = csp_buffer_get(0);
		if (packet == NULL) {
			return CSP_ERR_NOMEM;
		}

		/* Calculate sending size */
		unsigned int size = totalsize - count;
		if (size > mtu) {
			size = mtu;
		}

		/* Print debug */
		//csp_print("%s: %d:%d, sending at %p size %u\n", __func__, csp_conn_src(conn), csp_conn_sport(conn), (void *)((uint8_t *)data + count), size);

		/* Copy data */
		(memcpyfcn)((csp_memptr_t)(uintptr_t)packet->data, (csp_memptr_t)(uintptr_t)(((uint8_t *)data) + count), size);
		packet->length = size;

		/* Set fragment flag */
		conn->idout.flags |= CSP_FFRAG;

		/* Add SFP header */
		sfp_header = csp_sfp_header_add(packet);
		sfp_header->totalsize = htobe32(totalsize);
		sfp_header->offset = htobe32(count);

		/* Send data */
		csp_send(conn, packet);

		/* Increment count */
		count += size;
	}

	return CSP_ERR_NONE;
}